

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O1

void unmark_for_reference(H264_DecCtx_t *p_Dec,H264_FrameStore_t *fs)

{
  uint uVar1;
  long lVar2;
  
  uVar1 = *(uint *)&p_Dec->mem;
  if (((uVar1 & 1) != 0) && (*(long *)&p_Dec->next_state != 0)) {
    *(undefined4 *)(*(long *)&p_Dec->next_state + 0x2c) = 0;
  }
  if (((uVar1 & 2) != 0) && (*(long *)&p_Dec->mvc_valid != 0)) {
    *(undefined4 *)(*(long *)&p_Dec->mvc_valid + 0x2c) = 0;
  }
  if (uVar1 == 3) {
    if ((*(long *)&p_Dec->next_state != 0) && (lVar2 = *(long *)&p_Dec->mvc_valid, lVar2 != 0)) {
      *(undefined4 *)(*(long *)&p_Dec->next_state + 0x2c) = 0;
      *(undefined4 *)(lVar2 + 0x2c) = 0;
    }
    *(undefined4 *)(*(long *)&p_Dec->spt_decode_mtds + 0x2c) = 0;
  }
  *(undefined4 *)((long)&p_Dec->mem + 4) = 0;
  return;
}

Assistant:

static void unmark_for_reference(H264_DecCtx_t *p_Dec, H264_FrameStore_t* fs)
{
    H264_StorePic_t *cur_pic = NULL;
    if (fs->is_used & 1) {
        if (fs->top_field) {
            fs->top_field->used_for_reference = 0;
            cur_pic = fs->top_field;
        }
    }
    if (fs->is_used & 2) {
        if (fs->bottom_field) {
            fs->bottom_field->used_for_reference = 0;
            cur_pic = fs->bottom_field;
        }
    }
    if (fs->is_used == 3) {
        if (fs->top_field && fs->bottom_field) {
            fs->top_field->used_for_reference = 0;
            fs->bottom_field->used_for_reference = 0;
        }
        fs->frame->used_for_reference = 0;
        cur_pic = fs->frame;
    }
    fs->is_reference = 0;
    (void)cur_pic;
    (void)p_Dec;
}